

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O1

string * __thiscall lest::to_string_abi_cxx11_(string *__return_storage_ptr__,lest *this,char *txt)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 uVar2;
  undefined7 uVar3;
  size_t sVar4;
  string local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  undefined8 local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  string local_40;
  
  if (this == (lest *)0x0) {
    paVar1 = &local_80.field_2;
    local_80._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"{null string}","");
    local_40._M_string_length = local_80._M_string_length;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p == paVar1) {
      local_40.field_2._8_8_ = local_80.field_2._8_8_;
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    }
    else {
      local_40._M_dataplus._M_p = local_80._M_dataplus._M_p;
    }
    local_40.field_2._M_allocated_capacity._1_7_ = local_80.field_2._M_allocated_capacity._1_7_;
    local_40.field_2._M_local_buf[0] = local_80.field_2._M_local_buf[0];
    local_80._M_string_length = 0;
    local_80.field_2._M_local_buf[0] = '\0';
    local_60 = &local_50;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p == &local_40.field_2) {
      local_50._8_8_ = local_40.field_2._8_8_;
      local_80._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_60 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_40._M_dataplus._M_p;
      local_80._M_dataplus._M_p = (pointer)paVar1;
    }
  }
  else {
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    sVar4 = strlen((char *)this);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,this,this + sVar4);
    make_strg_string(&local_40,&local_80);
    local_60 = &local_50;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p == &local_40.field_2) {
      local_50._8_8_ = local_40.field_2._8_8_;
    }
    else {
      local_60 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_40._M_dataplus._M_p;
    }
  }
  uVar2 = local_40.field_2._M_allocated_capacity;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  uVar3 = local_40.field_2._M_allocated_capacity._1_7_;
  local_40.field_2._M_allocated_capacity =
       (ulong)(uint7)local_40.field_2._M_allocated_capacity._1_7_ << 8;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (local_60 == &local_50) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity = uVar2;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_50._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_60;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = uVar2;
  }
  __return_storage_ptr__->_M_string_length = local_40._M_string_length;
  local_50._M_allocated_capacity = (ulong)(uint7)uVar3 << 8;
  local_40._M_string_length = 0;
  local_58 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    local_60 = &local_50;
    operator_delete(local_80._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string to_string( char    const * const   txt ) { return txt ? make_strg_string( txt ) : "{null string}"; }